

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_NestedEnumValueToName_Test<absl::lts_20250127::Cord>::
~LiteTest_NestedEnumValueToName_Test
          (LiteTest_NestedEnumValueToName_Test<absl::lts_20250127::Cord> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, NestedEnumValueToName) {
  EXPECT_EQ("FOO", proto2_unittest::TestAllTypesLite::NestedEnum_Name(
                       proto2_unittest::TestAllTypesLite::FOO));
  EXPECT_EQ("BAR", proto2_unittest::TestAllTypesLite::NestedEnum_Name(
                       proto2_unittest::TestAllTypesLite::BAR));
  EXPECT_EQ("BAZ", proto2_unittest::TestAllTypesLite::NestedEnum_Name(
                       proto2_unittest::TestAllTypesLite::BAZ));
  EXPECT_EQ("", proto2_unittest::TestAllTypesLite::NestedEnum_Name(0));
  EXPECT_EQ("", proto2_unittest::TestAllTypesLite::NestedEnum_Name(999));
}